

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm.cc
# Opt level: O1

bool __thiscall
bssl::ParseAlgorithmIdentifier(bssl *this,Input input,Input *algorithm,Input *parameters)

{
  bool bVar1;
  Input input_00;
  Parser algorithm_identifier_parser;
  Parser parser;
  Parser local_50;
  Parser local_38;
  
  input_00.data_.size_ = (size_t)input.data_.data_;
  input_00.data_.data_ = (uchar *)this;
  der::Parser::Parser(&local_38,input_00);
  der::Parser::Parser(&local_50);
  bVar1 = der::Parser::ReadSequence(&local_38,&local_50);
  if (((bVar1) && (bVar1 = der::Parser::HasMore(&local_38), !bVar1)) &&
     (bVar1 = der::Parser::ReadTag(&local_50,6,(Input *)input.data_.size_), bVar1)) {
    (algorithm->data_).data_ = (uchar *)0x0;
    (algorithm->data_).size_ = 0;
    bVar1 = der::Parser::HasMore(&local_50);
    if ((!bVar1) || (bVar1 = der::Parser::ReadRawTLV(&local_50,algorithm), bVar1)) {
      bVar1 = der::Parser::HasMore(&local_50);
      return !bVar1;
    }
  }
  return false;
}

Assistant:

[[nodiscard]] bool ParseAlgorithmIdentifier(der::Input input,
                                            der::Input *algorithm,
                                            der::Input *parameters) {
  der::Parser parser(input);

  der::Parser algorithm_identifier_parser;
  if (!parser.ReadSequence(&algorithm_identifier_parser)) {
    return false;
  }

  // There shouldn't be anything after the sequence. This is by definition,
  // as the input to this function is expected to be a single
  // AlgorithmIdentifier.
  if (parser.HasMore()) {
    return false;
  }

  if (!algorithm_identifier_parser.ReadTag(CBS_ASN1_OBJECT, algorithm)) {
    return false;
  }

  // Read the optional parameters to a der::Input. The parameters can be at
  // most one TLV (for instance NULL or a sequence).
  //
  // Note that nothing is allowed after the single optional "parameters" TLV.
  // This is because RFC 5912's notation for AlgorithmIdentifier doesn't
  // explicitly list an extension point after "parameters".
  *parameters = der::Input();
  if (algorithm_identifier_parser.HasMore() &&
      !algorithm_identifier_parser.ReadRawTLV(parameters)) {
    return false;
  }
  return !algorithm_identifier_parser.HasMore();
}